

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::defaultListReporters
               (ostream *out,
               vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
               *descriptions,Verbosity verbosity)

{
  bool bVar1;
  Column *pCVar2;
  Column *rhs;
  ostream *poVar3;
  int in_EDX;
  undefined8 in_RSI;
  ostream *in_RDI;
  ReporterDescription *desc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *__range1;
  size_type maxNameLen;
  string *in_stack_fffffffffffffe28;
  Column *in_stack_fffffffffffffe30;
  Column *in_stack_fffffffffffffe40;
  Column *in_stack_fffffffffffffe48;
  Columns *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  string local_128 [16];
  Column *in_stack_fffffffffffffee8;
  ostream *in_stack_fffffffffffffef0;
  Column local_108;
  Column local_a0;
  reference local_60;
  ReporterDescription *local_58;
  __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
  local_50;
  undefined8 local_48;
  ReporterDescription *local_38;
  ReporterDescription *local_30;
  __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
  local_28;
  long local_20;
  int local_14;
  undefined8 local_10;
  ostream *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"Available reporters:\n");
  local_30 = (ReporterDescription *)
             std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
             begin((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
                    *)in_stack_fffffffffffffe28);
  local_38 = (ReporterDescription *)
             std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
             end((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
                 in_stack_fffffffffffffe28);
  local_28 = std::
             max_element<__gnu_cxx::__normal_iterator<Catch::ReporterDescription_const*,std::vector<Catch::ReporterDescription,std::allocator<Catch::ReporterDescription>>>,Catch::defaultListReporters(std::ostream&,std::vector<Catch::ReporterDescription,std::allocator<Catch::ReporterDescription>>const&,Catch::Verbosity)::__0>
                       (local_30,local_38);
  __gnu_cxx::
  __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
  ::operator->(&local_28);
  local_20 = std::__cxx11::string::size();
  local_48 = local_10;
  local_50._M_current =
       (ReporterDescription *)
       std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::begin
                 ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *
                  )in_stack_fffffffffffffe28);
  local_58 = (ReporterDescription *)
             std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
             end((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
                 in_stack_fffffffffffffe28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
                        *)in_stack_fffffffffffffe28);
    if (!bVar1) break;
    local_60 = __gnu_cxx::
               __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
               ::operator*(&local_50);
    if (local_14 == 0) {
      TextFlow::Column::Column(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      pCVar2 = TextFlow::Column::indent(&local_a0,2);
      TextFlow::Column::width(pCVar2,local_20 + 5);
      poVar3 = TextFlow::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::operator<<(poVar3,'\n');
      TextFlow::Column::~Column((Column *)0x19b95f);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe48,(char)((ulong)in_stack_fffffffffffffe40 >> 0x38));
      TextFlow::Column::Column(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      pCVar2 = TextFlow::Column::indent(&local_108,2);
      rhs = TextFlow::Column::width(pCVar2,local_20 + 5);
      TextFlow::Column::Column(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe48 =
           TextFlow::Column::initialIndent((Column *)&stack0xfffffffffffffe98,0);
      in_stack_fffffffffffffe40 = TextFlow::Column::indent(in_stack_fffffffffffffe48,2);
      TextFlow::Column::width(in_stack_fffffffffffffe40,0x48 - local_20);
      TextFlow::operator+(pCVar2,rhs);
      in_stack_fffffffffffffe30 =
           (Column *)TextFlow::operator<<(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      std::operator<<((ostream *)in_stack_fffffffffffffe30,'\n');
      TextFlow::Columns::~Columns((Columns *)0x19bab4);
      TextFlow::Column::~Column((Column *)0x19babe);
      TextFlow::Column::~Column((Column *)0x19bacb);
      std::__cxx11::string::~string(local_128);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
    ::operator++(&local_50);
  }
  poVar3 = std::operator<<(local_8,'\n');
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void
    defaultListReporters( std::ostream& out,
                          std::vector<ReporterDescription> const& descriptions,
                          Verbosity verbosity ) {
        out << "Available reporters:\n";
        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ReporterDescription const& lhs,
                                  ReporterDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            if ( verbosity == Verbosity::Quiet ) {
                out << TextFlow::Column( desc.name )
                           .indent( 2 )
                           .width( 5 + maxNameLen )
                    << '\n';
            } else {
                out << TextFlow::Column( desc.name + ':' )
                               .indent( 2 )
                               .width( 5 + maxNameLen ) +
                           TextFlow::Column( desc.description )
                               .initialIndent( 0 )
                               .indent( 2 )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                    << '\n';
            }
        }
        out << '\n' << std::flush;
    }